

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [2],
          uint *params_2,char (*params_3) [10],StringPtr *params_4,char (*params_5) [2])

{
  long lVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff60;
  CappedArray<char,_14UL> local_98;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  long local_40;
  long local_38;
  
  lVar1 = *(long *)(this + 8);
  local_40 = lVar1;
  if (lVar1 != 0) {
    local_40 = *(long *)this;
  }
  local_38 = 0;
  if (lVar1 != 0) {
    local_38 = lVar1 + -1;
  }
  local_50 = toCharSequence<char_const(&)[2]>((char (*) [2])params);
  toCharSequence<unsigned_int>(&local_98,(uint *)params_1);
  local_60 = toCharSequence<char_const(&)[10]>((char (*) [10])params_2);
  local_70.ptr = *(char **)*params_3;
  local_70.size_ = *(long *)(*params_3 + 8) - 1;
  local_80 = toCharSequence<char_const(&)[2]>((char (*) [2])params_4);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,(ArrayPtr<const_char> *)&local_98,
             (CappedArray<char,_14UL> *)&local_60,&local_70,&local_80,in_stack_ffffffffffffff60);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}